

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

void __thiscall MP1Node::sendMembershipList(MP1Node *this,Address *to,MsgTypes msgType)

{
  Member *pMVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  MsgTypes *data_00;
  pointer pMVar5;
  const_iterator local_78;
  MemberListEntry *local_70;
  Address local_66;
  iterator iStack_60;
  Address toAddr;
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  local_58;
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  local_50;
  iterator entry;
  char *numberOfMembersPtr;
  char *data;
  MessageHdr *msg;
  size_t msgsize;
  long numberOfMembers;
  MsgTypes msgType_local;
  Address *to_local;
  MP1Node *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"start sendMembershipList ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  msgsize = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::size
                      (&this->memberNode->memberList);
  data_00 = (MsgTypes *)malloc(msgsize * 0xe + 0x12);
  *data_00 = msgType;
  pMVar1 = this->memberNode;
  data_00[1] = *(MsgTypes *)(pMVar1->addr).addr;
  *(undefined2 *)(data_00 + 2) = *(undefined2 *)((pMVar1->addr).addr + 4);
  entry._M_current = (MemberListEntry *)((long)data_00 + 10);
  (entry._M_current)->id = (int)msgsize;
  (entry._M_current)->port = (short)(msgsize >> 0x20);
  *(short *)&(entry._M_current)->field_0x6 = (short)(msgsize >> 0x30);
  numberOfMembersPtr = (char *)((long)data_00 + 0x12);
  local_50._M_current =
       (MemberListEntry *)
       std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::begin
                 (&this->memberNode->memberList);
  do {
    while( true ) {
      local_58._M_current =
           (MemberListEntry *)
           std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::end
                     (&this->memberNode->memberList);
      bVar2 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar2) {
        (entry._M_current)->id = (undefined4)msgsize;
        (entry._M_current)->port = msgsize._4_2_;
        *(undefined2 *)&(entry._M_current)->field_0x6 = msgsize._6_2_;
        EmulNet::ENsend(this->emulNet,&this->memberNode->addr,to,(char *)data_00,
                        (int)msgsize * 0xe + 0x12);
        free(data_00);
        poVar4 = std::operator<<((ostream *)&std::cout,"...end sendMembershipList.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return;
      }
      iStack_60 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::begin
                            (&this->memberNode->memberList);
      bVar2 = __gnu_cxx::operator!=(&local_50,&stack0xffffffffffffffa0);
      if (bVar2) break;
LAB_0010c587:
      pMVar5 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_50);
      *(int *)numberOfMembersPtr = pMVar5->id;
      pMVar5 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_50);
      *(short *)(numberOfMembersPtr + 4) = pMVar5->port;
      pMVar5 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_50);
      *(long *)(numberOfMembersPtr + 6) = pMVar5->heartbeat;
      numberOfMembersPtr = numberOfMembersPtr + 0xe;
      __gnu_cxx::
      __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
      ::operator++(&local_50);
    }
    iVar3 = Params::getcurrtime(this->par);
    pMVar5 = __gnu_cxx::
             __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
             ::operator->(&local_50);
    if ((long)iVar3 - pMVar5->timestamp < 0x15) {
      iVar3 = Params::getcurrtime(this->par);
      pMVar5 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_50);
      if ((long)iVar3 - pMVar5->timestamp < 6) goto LAB_0010c587;
      msgsize = msgsize - 1;
      __gnu_cxx::
      __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
      ::operator++(&local_50);
    }
    else {
      Address::Address(&local_66);
      pMVar5 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_50);
      local_66.addr._0_4_ = pMVar5->id;
      pMVar5 = __gnu_cxx::
               __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
               ::operator->(&local_50);
      local_66.addr._4_2_ = pMVar5->port;
      Log::logNodeRemove(this->log,&this->memberNode->addr,&local_66);
      pMVar1 = this->memberNode;
      __gnu_cxx::
      __normal_iterator<MemberListEntry_const*,std::vector<MemberListEntry,std::allocator<MemberListEntry>>>
      ::__normal_iterator<MemberListEntry*>
                ((__normal_iterator<MemberListEntry_const*,std::vector<MemberListEntry,std::allocator<MemberListEntry>>>
                  *)&local_78,&local_50);
      local_70 = (MemberListEntry *)
                 std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::erase
                           (&pMVar1->memberList,local_78);
      msgsize = msgsize - 1;
      local_50._M_current = local_70;
    }
  } while( true );
}

Assistant:

void MP1Node::sendMembershipList(Address *to, enum MsgTypes msgType) {
    cout << "start sendMembershipList ..." << endl;

    long numberOfMembers = memberNode->memberList.size();
    //message structure: [MessageHdr] [Address] [Number of members] [Members...]
    size_t msgsize = sizeof(MessageHdr) + sizeof(memberNode->addr.addr) + sizeof(long) + (numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)));

    //malloc memory space for the header
    MessageHdr* msg = (MessageHdr *) malloc(msgsize * sizeof(char));

    //msg will be a pointer to an address
    char* data = (char*) (msg + 1);

    //set the message type
    msg->msgType = msgType;

    //set this node's address into the message
    memcpy(data, &memberNode->addr.addr, sizeof(memberNode->addr.addr));
    data += sizeof(memberNode->addr.addr);

    //set the number of members (for now)
    char* numberOfMembersPtr = data;
    memcpy(numberOfMembersPtr, &numberOfMembers, sizeof(long));
    data += sizeof(long);

    //set the members in list and delete members that have failed
    for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin(); entry != memberNode->memberList.end();) {
        if (entry != memberNode->memberList.begin()) {
            if (par->getcurrtime() - entry->timestamp > TREMOVE) {
#ifdef DEBUGLOG
                Address toAddr;
                memcpy(&toAddr.addr[0], &entry->id, sizeof(int));
                memcpy(&toAddr.addr[4], &entry->port, sizeof(short));
                log->logNodeRemove(&memberNode->addr, &toAddr);
#endif
                entry = memberNode->memberList.erase(entry);
                numberOfMembers--;
                continue;
            }
            //dont copy the failed not into the data
            if (par->getcurrtime() - entry->timestamp > TFAIL) {
                numberOfMembers--;
                ++entry;
                continue;
            }
        }

        memcpy(data, &entry->id, sizeof(int));
        data += sizeof(int);
        memcpy(data, &entry->port, sizeof(short));
        data += sizeof(short);
        memcpy(data, &entry->heartbeat, sizeof(long));
        data += sizeof(long);

        ++entry;
    }

    //set new number of members members were deleted
    memcpy(numberOfMembersPtr, &numberOfMembers, sizeof(long));

    //read new message size in case members were deleted
    msgsize = sizeof(MessageHdr) + sizeof(memberNode->addr.addr) + sizeof(long) + (numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)));

    //send membership list through network
    emulNet->ENsend(&memberNode->addr, to, (char *)msg, msgsize);   //send the membership list to network
    free(msg);

    cout << "...end sendMembershipList." << endl;
}